

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cc
# Opt level: O0

void __thiscall tt::Thread::start(Thread *this)

{
  int iVar1;
  ThreadData *pTVar2;
  void *__stat_loc;
  function<void_()> local_38;
  ThreadData *local_18;
  ThreadData *data;
  Thread *this_local;
  
  data = (ThreadData *)this;
  if (((this->m_started ^ 0xffU) & 1) == 0) {
    __assert_fail("!m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                  ,0x8a,"void tt::Thread::start()");
  }
  this->m_started = true;
  pTVar2 = (ThreadData *)operator_new(0x50);
  std::function<void_()>::function(&local_38,&this->m_func);
  detail::ThreadData::ThreadData(pTVar2,&local_38,&this->m_name,&this->m_tid,&this->m_latch);
  std::function<void_()>::~function(&local_38);
  __stat_loc = (void *)0x0;
  local_18 = pTVar2;
  iVar1 = pthread_create(&this->m_pthreadId,(pthread_attr_t *)0x0,detail::startThread,pTVar2);
  pTVar2 = local_18;
  if (iVar1 == 0) {
    CountDownLatch::wait(&this->m_latch,__stat_loc);
    if (this->m_tid < 1) {
      __assert_fail("m_tid>0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/HhTtLllL[P]web_server/h_webserver/base/Thread.cc"
                    ,0x94,"void tt::Thread::start()");
    }
  }
  else {
    this->m_started = false;
    if (local_18 != (ThreadData *)0x0) {
      detail::ThreadData::~ThreadData(local_18);
      operator_delete(pTVar2);
    }
  }
  return;
}

Assistant:

void Thread::start(){
	assert(!m_started);
	m_started = true;

	detail::ThreadData* data = new detail::ThreadData(m_func,m_name,&m_tid,&m_latch);
	
	if(pthread_create(&m_pthreadId,NULL,&detail::startThread,data)){
		m_started = false;
		delete data;
	}else{
		m_latch.wait();
		assert(m_tid>0);
	}

}